

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extents_alloc(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extents_t *extents,
             void *new_addr,size_t size,size_t pad,size_t alignment,_Bool slab,szind_t szind,
             _Bool *zero,_Bool *commit)

{
  extent_t *peVar1;
  long in_RDI;
  extent_t *extent;
  tsd_t *tsd;
  uint8_t state;
  _Bool in_stack_00000126;
  _Bool in_stack_00000127;
  size_t in_stack_00000128;
  void *in_stack_00000130;
  extents_t *in_stack_00000138;
  extent_hooks_t **in_stack_00000140;
  arena_t *in_stack_00000148;
  tsdn_t *in_stack_00000150;
  size_t in_stack_00000220;
  size_t in_stack_00000228;
  szind_t in_stack_00000238;
  _Bool *in_stack_00000240;
  _Bool *in_stack_00000248;
  undefined8 local_58;
  
  if (in_RDI == 0) {
    local_58 = (witness_tsdn_t *)0x0;
  }
  else {
    local_58 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_58,0xc,0);
  peVar1 = extent_recycle(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                          in_stack_00000130,in_stack_00000128,in_stack_00000220,in_stack_00000228,
                          in_stack_00000127,in_stack_00000238,in_stack_00000240,in_stack_00000248,
                          in_stack_00000126);
  return peVar1;
}

Assistant:

extent_t *
extents_alloc(tsdn_t *tsdn, arena_t *arena, extent_hooks_t **r_extent_hooks,
    extents_t *extents, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	assert(size + pad != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_t *extent = extent_recycle(tsdn, arena, r_extent_hooks, extents,
	    new_addr, size, pad, alignment, slab, szind, zero, commit, false);
	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}